

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O0

void Mio_WritePin(FILE *pFile,Mio_Pin_t *pPin,int NameLen,int fAllPins)

{
  undefined8 local_78;
  char *pPhaseNames [10];
  int fAllPins_local;
  int NameLen_local;
  Mio_Pin_t *pPin_local;
  FILE *pFile_local;
  
  memcpy(&local_78,&DAT_00f4fb40,0x50);
  if (fAllPins == 0) {
    fprintf((FILE *)pFile,"\n    PIN %*s  ",(ulong)(uint)NameLen,pPin->pName);
  }
  else {
    fprintf((FILE *)pFile,"PIN *  ");
  }
  fprintf((FILE *)pFile,"%7s ",pPhaseNames[(ulong)pPin->Phase - 1]);
  fprintf((FILE *)pFile,"%3d ",(ulong)(uint)(int)pPin->dLoadInput);
  fprintf((FILE *)pFile,"%3d ",(ulong)(uint)(int)pPin->dLoadMax);
  fprintf((FILE *)pFile,"%8.2f ",pPin->dDelayBlockRise);
  fprintf((FILE *)pFile,"%8.2f ",pPin->dDelayFanoutRise);
  fprintf((FILE *)pFile,"%8.2f ",pPin->dDelayBlockFall);
  fprintf((FILE *)pFile,"%8.2f",pPin->dDelayFanoutFall);
  return;
}

Assistant:

void Mio_WritePin( FILE * pFile, Mio_Pin_t * pPin, int NameLen, int fAllPins )
{
    char * pPhaseNames[10] = { "UNKNOWN", "INV", "NONINV" };
    if ( fAllPins )
        fprintf( pFile, "PIN *  " );
    else
        fprintf( pFile, "\n    PIN %*s  ", NameLen, pPin->pName );
    fprintf( pFile, "%7s ",   pPhaseNames[pPin->Phase] );
    fprintf( pFile, "%3d ",   (int)pPin->dLoadInput );
    fprintf( pFile, "%3d ",   (int)pPin->dLoadMax );
    fprintf( pFile, "%8.2f ", pPin->dDelayBlockRise );
    fprintf( pFile, "%8.2f ", pPin->dDelayFanoutRise );
    fprintf( pFile, "%8.2f ", pPin->dDelayBlockFall );
    fprintf( pFile, "%8.2f",  pPin->dDelayFanoutFall );
}